

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O0

string * __thiscall
cppassert::DefaultFormatter::formatPredicateFailureMessage
          (string *__return_storage_ptr__,DefaultFormatter *this,char *predicate,char *value1Text,
          char *value2Text,string *value1,string *value2)

{
  AssertionMessage *pAVar1;
  char local_4e [14];
  AssertionMessage local_40;
  AssertionMessage msg;
  string *value1_local;
  char *value2Text_local;
  char *value1Text_local;
  char *predicate_local;
  DefaultFormatter *this_local;
  
  msg.stream_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )value1;
  value1_local = (string *)value2Text;
  value2Text_local = value1Text;
  value1Text_local = predicate;
  predicate_local = (char *)this;
  this_local = (DefaultFormatter *)__return_storage_ptr__;
  internal::AssertionMessage::AssertionMessage(&local_40);
  pAVar1 = internal::AssertionMessage::operator<<
                     (&local_40,(char (*) [31])"Assertion failure value of: ( ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&value2Text_local);
  local_4e[1] = 0x20;
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,local_4e + 1);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&value1Text_local);
  local_4e[0] = ' ';
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,local_4e);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char **)&value1_local);
  internal::AssertionMessage::operator<<(pAVar1,(char (*) [3])0x1ac99b);
  pAVar1 = internal::AssertionMessage::operator<<(&local_40,(char (*) [4])"\n  ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&value2Text_local);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [16])" evaluated to: ");
  internal::AssertionMessage::operator<<
            (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    msg.stream_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
  pAVar1 = internal::AssertionMessage::operator<<(&local_40,(char (*) [4])"\n  ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char **)&value1_local);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [16])" evaluated to: ");
  internal::AssertionMessage::operator<<(pAVar1,value2);
  internal::AssertionMessage::str_abi_cxx11_(__return_storage_ptr__,&local_40);
  internal::AssertionMessage::~AssertionMessage(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultFormatter::formatPredicateFailureMessage(const char* predicate,
                                    const char* value1Text,
                                    const char* value2Text,
                                    const std::string &value1,
                                    const std::string &value2)
{
    AssertionMessage msg;
    msg << "Assertion failure value of: ( " << value1Text <<' '<<predicate<<' '
        << value2Text<<" )";
    msg << "\n  "<<value1Text<<" evaluated to: "<<value1;
    msg << "\n  "<<value2Text<<" evaluated to: "<<value2;
    return msg.str();
}